

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.h
# Opt level: O3

bool __thiscall
draco::PointCloudSequentialDecoder::DecodeGeometryData(PointCloudSequentialDecoder *this)

{
  long lVar1;
  ValueType VVar2;
  DecoderBuffer *pDVar3;
  long lVar4;
  
  pDVar3 = (this->super_PointCloudDecoder).buffer_;
  lVar4 = pDVar3->data_size_;
  lVar1 = pDVar3->pos_ + 4;
  if (lVar1 <= lVar4) {
    VVar2 = *(ValueType *)(pDVar3->data_ + pDVar3->pos_);
    pDVar3->pos_ = lVar1;
    ((this->super_PointCloudDecoder).point_cloud_)->num_points_ = VVar2;
  }
  return lVar1 <= lVar4;
}

Assistant:

DecoderBuffer *buffer() { return buffer_; }